

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# survey.c
# Opt level: O3

void surv0_ctx_recv(void *arg,nni_aio *aio)

{
  nni_msg *mtx;
  long lVar1;
  _Bool _Var2;
  uint uVar3;
  int iVar4;
  nni_time nVar5;
  nni_msg *local_40;
  nni_msg *msg;
  
  lVar1 = *arg;
  nVar5 = nni_clock();
  mtx = (nni_msg *)(lVar1 + 0x20);
  nni_mtx_lock((nni_mtx *)mtx);
  if ((*(int *)((long)arg + 8) != 0) && (nVar5 < *(ulong *)((long)arg + 0x78))) {
    msg = mtx;
    uVar3 = nni_aio_get_timeout(aio);
    if (*(nni_time *)((long)arg + 0x78) < nVar5 + uVar3 || (int)uVar3 < 1) {
      nni_aio_set_expire(aio,*(nni_time *)((long)arg + 0x78));
    }
    do {
      iVar4 = nni_lmq_get((nni_lmq *)((long)arg + 0x10),&local_40);
      if (iVar4 != 0) {
        _Var2 = nni_aio_start(aio,surv0_ctx_cancel,arg);
        if (_Var2) {
          nni_list_append((nni_list *)((long)arg + 0x58),aio);
        }
        nni_mtx_unlock((nni_mtx *)msg);
        return;
      }
      _Var2 = nni_lmq_empty((nni_lmq *)((long)arg + 0x10));
      if (_Var2 && (void *)(lVar1 + 0x48) == arg) {
        nni_pollable_clear((nni_pollable *)(lVar1 + 0x118));
      }
      local_40 = nni_msg_unique(local_40);
    } while (local_40 == (nni_msg *)0x0);
    nni_mtx_unlock((nni_mtx *)msg);
    nni_aio_finish_msg(aio,local_40);
    return;
  }
  nni_mtx_unlock((nni_mtx *)mtx);
  nni_aio_finish_error(aio,NNG_ESTATE);
  return;
}

Assistant:

static void
surv0_ctx_recv(void *arg, nni_aio *aio)
{
	surv0_ctx   *ctx  = arg;
	surv0_sock  *sock = ctx->sock;
	nni_msg     *msg;
	nni_time     now;
	nni_duration timeout;

	now = nni_clock();

	nni_mtx_lock(&sock->mtx);
	if ((ctx->survey_id == 0) || (now >= ctx->expire)) {
		nni_mtx_unlock(&sock->mtx);
		nni_aio_finish_error(aio, NNG_ESTATE);
		return;
	}

	timeout = nni_aio_get_timeout(aio);
	if ((timeout < 1) || ((now + timeout) > ctx->expire)) {
		// limit the timeout to the survey time
		nni_aio_set_expire(aio, ctx->expire);
	}

again:
	if (nni_lmq_get(&ctx->recv_lmq, &msg) != 0) {
		if (!nni_aio_start(aio, &surv0_ctx_cancel, ctx)) {
			nni_mtx_unlock(&sock->mtx);
			return;
		}
		nni_list_append(&ctx->recv_queue, aio);
		nni_mtx_unlock(&sock->mtx);
		return;
	}
	if (nni_lmq_empty(&ctx->recv_lmq) && (ctx == &sock->ctx)) {
		nni_pollable_clear(&sock->readable);
	}
	if ((msg = nni_msg_unique(msg)) == NULL) {
		goto again;
	}

	nni_mtx_unlock(&sock->mtx);
	nni_aio_finish_msg(aio, msg);
}